

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxParser.cpp
# Opt level: O3

uint32_t __thiscall Jinx::Impl::Parser::ParseSubscriptSet(Parser *this)

{
  SymbolList *pSVar1;
  pointer pSVar2;
  uint32_t uVar3;
  
  uVar3 = 0;
  if ((this->m_error == false) &&
     (uVar3 = 0,
     (this->m_currentSymbol)._M_current !=
     (this->m_symbolList->
     super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>)._M_impl.
     super__Vector_impl_data._M_finish)) {
    uVar3 = 0;
    do {
      pSVar1 = this->m_symbolList;
      pSVar2 = (this->m_currentSymbol)._M_current;
      if (pSVar2 == (pSVar1->
                    super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>).
                    _M_impl.super__Vector_impl_data._M_finish) {
        return uVar3;
      }
      if (pSVar2->type != SquareOpen) {
        return uVar3;
      }
      this->m_lastLine = pSVar2->lineNumber;
      (this->m_currentSymbol)._M_current = pSVar2 + 1;
      ParseExpression(this,(pSVar1->
                           super__Vector_base<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>
                           )._M_impl.super__Vector_impl_data._M_finish);
      Expect(this,SquareClose,(char *)0x0);
      uVar3 = uVar3 + 1;
    } while (this->m_error != true);
  }
  return uVar3;
}

Assistant:

inline_t uint32_t Parser::ParseSubscriptSet()
	{
		if (m_error || m_currentSymbol == m_symbolList.end())
			return 0;
		uint32_t count = 0;
		while (Accept(SymbolType::SquareOpen))
		{
			ParseExpression();
			Expect(SymbolType::SquareClose);
			++count;
		}
		return count;
	}